

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.h
# Opt level: O0

void rapidjson::internal::Grisu2(double value,char *buffer,int *length,int *K)

{
  int *this;
  int *this_00;
  int *this_01;
  DiyFp DVar1;
  DiyFp Wm;
  undefined1 local_c8 [8];
  DiyFp Wp;
  DiyFp local_98;
  undefined1 local_88 [8];
  DiyFp W;
  undefined1 local_68 [8];
  DiyFp c_mk;
  DiyFp w_p;
  DiyFp w_m;
  DiyFp v;
  int *K_local;
  int *length_local;
  char *buffer_local;
  double value_local;
  
  this = &w_m.e;
  DiyFp::DiyFp((DiyFp *)this,value);
  this_00 = &w_p.e;
  DiyFp::DiyFp((DiyFp *)this_00);
  this_01 = &c_mk.e;
  DiyFp::DiyFp((DiyFp *)this_01);
  DiyFp::NormalizedBoundaries((DiyFp *)this,(DiyFp *)this_00,(DiyFp *)this_01);
  DVar1 = GetCachedPower((int)w_p.f,K);
  W._8_8_ = DVar1.f;
  c_mk.f._0_4_ = DVar1.e;
  local_68 = (undefined1  [8])W._8_8_;
  DVar1 = DiyFp::Normalize((DiyFp *)this);
  local_98.f = DVar1.f;
  local_98.e = DVar1.e;
  DVar1 = DiyFp::operator*(&local_98,(DiyFp *)local_68);
  Wp._8_8_ = DVar1.f;
  W.f._0_4_ = DVar1.e;
  local_88 = (undefined1  [8])Wp._8_8_;
  DVar1 = DiyFp::operator*((DiyFp *)this_01,(DiyFp *)local_68);
  local_c8 = (undefined1  [8])DVar1.f;
  Wp.f._0_4_ = DVar1.e;
  DVar1 = DiyFp::operator*((DiyFp *)this_00,(DiyFp *)local_68);
  local_c8 = (undefined1  [8])((long)local_c8 - 1);
  DigitGen((DiyFp *)local_88,(DiyFp *)local_c8,(long)local_c8 - (DVar1.f + 1),buffer,length,K);
  return;
}

Assistant:

inline void Grisu2(double value, char* buffer, int* length, int* K) {
    const DiyFp v(value);
    DiyFp w_m, w_p;
    v.NormalizedBoundaries(&w_m, &w_p);

    const DiyFp c_mk = GetCachedPower(w_p.e, K);
    const DiyFp W = v.Normalize() * c_mk;
    DiyFp Wp = w_p * c_mk;
    DiyFp Wm = w_m * c_mk;
    Wm.f++;
    Wp.f--;
    DigitGen(W, Wp, Wp.f - Wm.f, buffer, length, K);
}